

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-summon.c
# Opt level: O3

parser_error parse_summon_name(parser *p)

{
  void *pvVar1;
  undefined8 *v;
  char *pcVar2;
  
  pvVar1 = parser_priv(p);
  v = (undefined8 *)mem_zalloc(0x40);
  *v = pvVar1;
  parser_setpriv(p,v);
  pcVar2 = parser_getstr(p,"name");
  pcVar2 = string_make(pcVar2);
  v[1] = pcVar2;
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_summon_name(struct parser *p) {
	struct summon *h = parser_priv(p);
	struct summon *s = mem_zalloc(sizeof *s);
	s->next = h;
	parser_setpriv(p, s);
	s->name = string_make(parser_getstr(p, "name"));

	return PARSE_ERROR_NONE;
}